

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O1

uint32_t chck_hash_table_collisions(chck_hash_table *table)

{
  uint32_t uVar1;
  chck_hash_table *pcVar2;
  ulong uVar3;
  byte *pbVar4;
  
  if (table != (chck_hash_table *)0x0) {
    uVar1 = 0;
    for (pcVar2 = table->next; pcVar2 != (chck_hash_table *)0x0; pcVar2 = pcVar2->next) {
      uVar3 = 0;
      while( true ) {
        if (uVar3 < (pcVar2->meta).count) {
          pbVar4 = (pcVar2->meta).table + uVar3 * (pcVar2->meta).member;
          uVar3 = uVar3 + 1;
        }
        else {
          pbVar4 = (byte *)0x0;
        }
        if (pbVar4 == (byte *)0x0) break;
        uVar1 = uVar1 + *pbVar4;
      }
    }
    return uVar1;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                0x157,"uint32_t chck_hash_table_collisions(struct chck_hash_table *)");
}

Assistant:

uint32_t
chck_hash_table_collisions(struct chck_hash_table *table)
{
   assert(table);

   uint32_t collisions = 0;
   for (struct chck_hash_table *t = table->next; t; t = t->next) {
      struct header *hdr;
      chck_lut_for_each(&t->meta, hdr) {
         if (hdr->placed)
            ++collisions;
      }
   }

   return collisions;
}